

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O2

XML_Char * xlsxioread_sheet_next_cell(xlsxioreadersheet sheethandle)

{
  XML_Char *pXVar1;
  XML_Status XVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  
  if (sheethandle == (xlsxioreadersheet)0x0) {
    return (XML_Char *)0x0;
  }
  uVar6 = (sheethandle->processcallbackdata).flags;
  do {
    if (((uVar6 & 2) == 0) && (uVar3 = sheethandle->paddingcol, uVar3 != 0)) {
      uVar7 = (sheethandle->processcallbackdata).cols;
      if (uVar7 < uVar3) {
        sVar4 = sheethandle->paddingrow;
        sheethandle->paddingcol = 0;
        if (sVar4 == 0) {
          return (XML_Char *)0x0;
        }
LAB_0010529d:
        sheethandle->lastrownr = sheethandle->lastrownr + 1;
        sheethandle->paddingrow = sVar4 + 1;
        if ((sheethandle->processcallbackdata).rownr <= sVar4 + 2) {
          return (XML_Char *)0x0;
        }
        sheethandle->paddingcol = 1;
        return (XML_Char *)0x0;
      }
LAB_001052c6:
      if (uVar7 <= sheethandle->lastcolnr && (uVar7 != 0 && (uVar6 & 4) != 0)) {
        return (XML_Char *)0x0;
      }
      sheethandle->paddingcol = uVar3 + 1;
      sheethandle->lastcolnr = sheethandle->lastcolnr + 1;
LAB_00105312:
      pcVar5 = strdup("");
      return pcVar5;
    }
    if (((uVar6 & 1) == 0) && (sVar4 = sheethandle->paddingrow, sVar4 != 0)) {
      uVar7 = (sheethandle->processcallbackdata).cols;
      uVar3 = sheethandle->paddingcol;
      if ((uVar6 & 2) != 0 || uVar7 < uVar3) {
        sheethandle->paddingcol = 0;
        goto LAB_0010529d;
      }
      goto LAB_001052c6;
    }
    if ((((uVar6 & 4) != 0) && (uVar3 = (sheethandle->processcallbackdata).cols, uVar3 != 0)) &&
       (uVar3 <= sheethandle->lastcolnr)) {
      return (XML_Char *)0x0;
    }
    if (((sheethandle->processcallbackdata).celldata == (XML_Char *)0x0) &&
       (XVar2 = expat_process_zip_file_resume
                          (sheethandle->zipfile,(sheethandle->processcallbackdata).xmlparser),
       XVar2 != XML_STATUS_SUSPENDED)) {
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
    }
    uVar6 = (sheethandle->processcallbackdata).flags;
    if (((uVar6 & 1) == 0) &&
       (uVar3 = sheethandle->lastrownr + 1, uVar3 < (sheethandle->processcallbackdata).rownr)) {
      sheethandle->paddingrow = uVar3;
      sVar4 = 1;
    }
    else {
      if (((uVar6 & 2) == 0) &&
         (uVar3 = sheethandle->lastcolnr + 1, uVar3 < (sheethandle->processcallbackdata).colnr)) {
        sheethandle->lastcolnr = uVar3;
        goto LAB_00105312;
      }
      pXVar1 = (sheethandle->processcallbackdata).celldata;
      (sheethandle->processcallbackdata).celldata = (XML_Char *)0x0;
      if (pXVar1 != (XML_Char *)0x0) {
        uVar3 = (sheethandle->processcallbackdata).colnr;
LAB_00105249:
        sheethandle->lastcolnr = uVar3;
        return pXVar1;
      }
      uVar3 = (sheethandle->processcallbackdata).colnr;
      sheethandle->lastrownr = (sheethandle->processcallbackdata).rownr;
      if (((uVar6 & 2) != 0) || ((sheethandle->processcallbackdata).cols <= uVar3))
      goto LAB_00105249;
      sVar4 = sheethandle->lastcolnr + 1;
    }
    sheethandle->paddingcol = sVar4;
  } while( true );
}

Assistant:

DLL_EXPORT_XLSXIO XLSXIOCHAR* xlsxioread_sheet_next_cell (xlsxioreadersheet sheethandle)
{
  XML_Char* result;
  if (!sheethandle)
    return NULL;
  //if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) {
  if ((!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->paddingcol) || (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->paddingrow)) {
    if ((/*sheethandle->processcallbackdata.cols > 0 &&*/ sheethandle->paddingcol > sheethandle->processcallbackdata.cols) || (sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
      //last empty column added, finish row
      sheethandle->paddingcol = 0;
      //when padding rows prepare for the next one
      if (sheethandle->paddingrow) {
        sheethandle->lastrownr++;
        sheethandle->paddingrow++;
        if (sheethandle->paddingrow + 1 < sheethandle->processcallbackdata.rownr) {
          sheethandle->paddingcol = 1;
        }
      }
      return NULL;
    } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
      //end of line when out of bounds
      return NULL;
    } else {
      //add another empty column
      sheethandle->paddingcol++;
      sheethandle->lastcolnr++;
      return XML_Char_dup(X(""));
    }
  } else if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
    //end of line when out of bounds
    return NULL;
  }
  //get value
  if (!sheethandle->processcallbackdata.celldata)
    if (expat_process_zip_file_resume(sheethandle->zipfile, sheethandle->processcallbackdata.xmlparser) != XML_STATUS_SUSPENDED)
      sheethandle->processcallbackdata.celldata = NULL;
  //insert empty rows if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_ROWS) && sheethandle->lastrownr + 1 < sheethandle->processcallbackdata.rownr) {
    sheethandle->paddingrow = sheethandle->lastrownr + 1;
    sheethandle->paddingcol = sheethandle->processcallbackdata.colnr*0 + 1;
    return xlsxioread_sheet_next_cell(sheethandle);
  }
  //insert empty column before if needed
  if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS)) {
    if (sheethandle->lastcolnr + 1 < sheethandle->processcallbackdata.colnr) {
      if (0) {
      //if ((sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EXTRA_CELLS) && sheethandle->processcallbackdata.cols > 0 && sheethandle->lastcolnr >= sheethandle->processcallbackdata.cols) {
        //end of line when out of bounds
        return NULL;
      } else {
        sheethandle->lastcolnr++;
        return XML_Char_dup(X(""));
      }
    }
  }
  result = sheethandle->processcallbackdata.celldata;
  sheethandle->processcallbackdata.celldata = NULL;
  //end of row
  if (!result) {
    sheethandle->lastrownr = sheethandle->processcallbackdata.rownr;
    //insert empty column at end of row if needed
    if (!(sheethandle->processcallbackdata.flags & XLSXIOREAD_SKIP_EMPTY_CELLS) && sheethandle->processcallbackdata.colnr < sheethandle->processcallbackdata.cols) {
      sheethandle->paddingcol = sheethandle->lastcolnr + 1;
      return xlsxioread_sheet_next_cell(sheethandle);
    }
  }
  sheethandle->lastcolnr = sheethandle->processcallbackdata.colnr;
  return result;
}